

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuStepType(sqlite3rbu *p,char **pzMask)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  uchar *z;
  int local_20;
  int iVal;
  int res;
  int iCol;
  char **pzMask_local;
  sqlite3rbu *p_local;
  
  iVar2 = (p->objiter).nCol;
  local_20 = 0;
  iVar1 = sqlite3_column_type((p->objiter).pSelect,iVar2);
  if (iVar1 == 1) {
    iVar2 = sqlite3_column_int((p->objiter).pSelect,iVar2);
    switch(iVar2) {
    case 0:
      local_20 = 1;
      break;
    case 1:
      local_20 = 2;
      break;
    case 2:
      local_20 = 3;
      break;
    case 3:
      local_20 = 4;
      break;
    case 4:
      local_20 = 5;
    }
  }
  else if (iVar1 == 3) {
    puVar3 = sqlite3_column_text((p->objiter).pSelect,iVar2);
    if (puVar3 == (uchar *)0x0) {
      p->rc = 7;
    }
    else {
      *pzMask = (char *)puVar3;
    }
    local_20 = 6;
  }
  if (local_20 == 0) {
    rbuBadControlError(p);
  }
  return local_20;
}

Assistant:

static int rbuStepType(sqlite3rbu *p, const char **pzMask){
  int iCol = p->objiter.nCol;     /* Index of rbu_control column */
  int res = 0;                    /* Return value */

  switch( sqlite3_column_type(p->objiter.pSelect, iCol) ){
    case SQLITE_INTEGER: {
      int iVal = sqlite3_column_int(p->objiter.pSelect, iCol);
      switch( iVal ){
        case 0: res = RBU_INSERT;     break;
        case 1: res = RBU_DELETE;     break;
        case 2: res = RBU_REPLACE;    break;
        case 3: res = RBU_IDX_DELETE; break;
        case 4: res = RBU_IDX_INSERT; break;
      }
      break;
    }

    case SQLITE_TEXT: {
      const unsigned char *z = sqlite3_column_text(p->objiter.pSelect, iCol);
      if( z==0 ){
        p->rc = SQLITE_NOMEM;
      }else{
        *pzMask = (const char*)z;
      }
      res = RBU_UPDATE;

      break;
    }

    default:
      break;
  }

  if( res==0 ){
    rbuBadControlError(p);
  }
  return res;
}